

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_logger.c
# Opt level: O3

mpt_logger * mpt_config_logger(mpt_config *cfg)

{
  int iVar1;
  mpt_logger *info;
  mpt_logger *local_18;
  
  local_18 = (mpt_logger *)0x0;
  if (cfg == (mpt_config *)0x0) {
    iVar1 = mpt_config_get((mpt_config *)0x0,"mpt.logger",0x81,&local_18);
    if (iVar1 < 0 || local_18 == (mpt_logger *)0x0) {
      mpt_config_get((mpt_config *)0x0,"mpt.output",0x81,&local_18);
    }
  }
  else {
    iVar1 = mpt_config_getp(cfg,(mpt_path *)0x0,0x81,&local_18);
    if (iVar1 < 0 || local_18 == (mpt_logger *)0x0) {
      iVar1 = mpt_config_get(cfg,"logger",0x81,&local_18);
      if (iVar1 < 0 || local_18 == (mpt_logger *)0x0) {
        mpt_config_get(cfg,"output",0x81,&local_18);
      }
    }
  }
  return local_18;
}

Assistant:

extern MPT_INTERFACE(logger) *mpt_config_logger(const MPT_INTERFACE(config) *cfg)
{
	MPT_INTERFACE(logger) *info = 0;
	
	if (!cfg) {
		/* search global logger */
		if ((mpt_config_get(0, "mpt.logger", MPT_ENUM(TypeLoggerPtr), &info)) >= 0
		    && info) {
			return info;
		}
		/* fallback to compatible 'output' */
		mpt_config_get(0, "mpt.output", MPT_ENUM(TypeLoggerPtr), &info);
		return info;
	}
	/* try direct interface */
	if ((mpt_config_getp(cfg, 0, MPT_ENUM(TypeLoggerPtr), &info)) >= 0
	    && info) {
		return info;
	}
	/* search local logger */
	if ((mpt_config_get(cfg, "logger", MPT_ENUM(TypeLoggerPtr), &info)) >= 0
	    && info) {
		return info;
	}
	/* fallback to compatible 'output' */
	mpt_config_get(cfg, "output", MPT_ENUM(TypeLoggerPtr), &info);
	return info;
}